

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O2

void __thiscall pstack::Dwarf::Ranges::Ranges(Ranges *this,DIE *die,uintmax_t base)

{
  byte bVar1;
  int iVar2;
  uintmax_t uVar3;
  undefined4 extraout_var;
  Exception *pEVar4;
  long extraout_RDX;
  long extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong len;
  uintmax_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 local_268 [8];
  uintmax_t start;
  element_type *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_250;
  uint local_248;
  undefined1 local_c8 [8];
  Attribute ranges;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  element_type *local_88;
  _Alloc_hider a_Stack_80 [2];
  _Alloc_hider local_70;
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  uint local_48;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_40;
  uintmax_t local_38;
  uintmax_t end;
  
  (this->
  super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)this;
  DIE::attribute((Attribute *)local_c8,die,DW_AT_ranges,false);
  if (4 < ((die->unit).super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          version) {
    Elf::Section::io((Section *)&local_88);
    local_68._0_8_ = DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_c8);
    iVar2 = (*local_88->_vptr_Reader[8])();
    local_68._8_8_ = CONCAT44(extraout_var,iVar2);
    local_68._16_8_ = local_88;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_80[0]._M_p;
    local_88 = (element_type *)0x0;
    a_Stack_80[0]._M_p = (pointer)0x0;
    local_48 = 8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_80);
    local_70._M_p =
         (pointer)(die->unit).super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
    len = (ulong)((element_type *)local_70._M_p)->addrlen;
    do {
      bVar1 = DWARFReader::getu8((DWARFReader *)local_68);
      switch(bVar1) {
      case 0:
        goto switchD_00150579_caseD_0;
      case 1:
        auVar7 = (**(code **)(*(long *)local_68._16_8_ + 0x18))(local_68._16_8_,local_68._0_8_);
        local_68._0_8_ = local_68._0_8_ + auVar7._8_8_;
        base = Unit::addrx((Unit *)local_70._M_p,auVar7._0_8_);
        break;
      case 2:
        (**(code **)(*(long *)local_68._16_8_ + 0x18))(local_68._16_8_,local_68._0_8_);
        local_68._0_8_ = extraout_RDX + local_68._0_8_;
        (**(code **)(*(long *)local_68._16_8_ + 0x18))();
        local_68._0_8_ = local_68._0_8_ + extraout_RDX_00;
        pEVar4 = (Exception *)__cxa_allocate_exception(0x1a0);
        memset((Exception *)local_268,0,0x1a0);
        Exception::Exception((Exception *)local_268);
        std::operator<<((ostream *)&start,"DW_RLE_startx_endx is not handled");
        Exception::Exception(pEVar4,(Exception *)local_268);
        __cxa_throw(pEVar4,&Exception::typeinfo,Exception::~Exception);
      case 3:
        auVar7 = (**(code **)(*(long *)local_68._16_8_ + 0x18))(local_68._16_8_,local_68._0_8_);
        local_68._0_8_ = local_68._0_8_ + auVar7._8_8_;
        local_268 = (undefined1  [8])Unit::addrx((Unit *)local_70._M_p,auVar7._0_8_);
        auVar7 = (**(code **)(*(long *)local_68._16_8_ + 0x18))(local_68._16_8_,local_68._0_8_);
        local_68._0_8_ = local_68._0_8_ + auVar7._8_8_;
        local_38 = auVar7._0_8_ + (long)local_268;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long>(local_40,(unsigned_long *)local_268,&local_38);
        break;
      case 4:
        auVar7 = (**(code **)(*(long *)local_68._16_8_ + 0x18))(local_68._16_8_,local_68._0_8_);
        local_68._0_8_ = auVar7._8_8_ + local_68._0_8_;
        auVar6 = (**(code **)(*(long *)local_68._16_8_ + 0x18))(local_68._16_8_,local_68._0_8_);
        local_68._0_8_ = local_68._0_8_ + auVar6._8_8_;
        local_268 = (undefined1  [8])(auVar7._0_8_ + base);
        local_38 = auVar6._0_8_ + base;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long,unsigned_long>(local_40,(unsigned_long *)local_268,&local_38);
        break;
      case 5:
        base = DWARFReader::getuint((DWARFReader *)local_68,len);
        break;
      case 6:
        local_268 = (undefined1  [8])DWARFReader::getuint((DWARFReader *)local_68,len);
        local_38 = DWARFReader::getuint((DWARFReader *)local_68,len);
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long&>(local_40,(unsigned_long *)local_268,&local_38)
        ;
        break;
      case 7:
        local_268 = (undefined1  [8])DWARFReader::getuint((DWARFReader *)local_68,len);
        auVar7 = (**(code **)(*(long *)local_68._16_8_ + 0x18))(local_68._16_8_,local_68._0_8_);
        local_68._0_8_ = local_68._0_8_ + auVar7._8_8_;
        local_38 = auVar7._0_8_ + (long)local_268;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long>(local_40,(unsigned_long *)local_268,&local_38);
        break;
      default:
        pEVar4 = (Exception *)__cxa_allocate_exception(0x1a0);
        memset((Exception *)local_268,0,0x1a0);
        Exception::Exception((Exception *)local_268);
        std::operator<<((ostream *)&start,"unhandled DW_RLE_ entry ");
        std::ostream::operator<<((ostream *)&start,(uint)bVar1);
        Exception::Exception(pEVar4,(Exception *)local_268);
        __cxa_throw(pEVar4,&Exception::typeinfo,Exception::~Exception);
      }
    } while( true );
  }
  Elf::Section::io((Section *)&ranges.formp);
  local_268 = (undefined1  [8])DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_c8)
  ;
  start = (**(code **)(*(long *)ranges.formp + 0x40))();
  local_258 = (element_type *)ranges.formp;
  _Stack_250._M_pi = _Stack_90._M_pi;
  ranges.formp = (FormEntry *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_248 = 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_90);
  while( true ) {
    uVar5 = base;
    uVar3 = DWARFReader::getuint((DWARFReader *)local_268,8);
    base = DWARFReader::getuint((DWARFReader *)local_268,8);
    if (base == 0 && uVar3 == 0) break;
    if (uVar3 != 0xffffffffffffffff) {
      local_68._0_8_ = uVar3 + uVar5;
      local_68._8_8_ = base + uVar5;
      std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                (local_40,(pair<unsigned_long,_unsigned_long> *)local_68);
      base = uVar5;
    }
  }
  this_00 = &_Stack_250;
LAB_001506ef:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  DIE::~DIE((DIE *)local_c8);
  return;
switchD_00150579_caseD_0:
  this_00 = &_Stack_50;
  goto LAB_001506ef;
}

Assistant:

Ranges::Ranges(const DIE &die, uintmax_t base) {

    auto ranges = die.attribute(DW_AT_ranges);

    if (die.getUnit()->version < 5) {
        // DWARF4 units use debug_ranges
        DWARFReader reader(die.getUnit()->dwarf->debugRanges.io(), uintmax_t(ranges));
        for (;;) {
            auto start = reader.getuint(sizeof (Elf::Addr));
            auto end = reader.getuint(sizeof (Elf::Addr));
            if (start == 0 && end == 0)
                break;
            if (start == std::numeric_limits<Elf::Addr>::max())
                base = end;
            else
                emplace_back(std::make_pair(start + base, end + base));
        }
    } else {
        DWARFReader r(die.getUnit()->dwarf->debugRangelists.io(), uintmax_t(ranges));

        // const auto &elf = die.getUnit()->dwarf->elf;
        // auto &addrs = elf->getDebugSection(".debug_addr", SHT_NULL); // XXX: would be used by the "x" ops below

        auto addrlen = die.getUnit()->addrlen;
        auto &unit = *die.getUnit();
        for (bool done = false; !done;) {
            auto entryType = DW_RLE(r.getu8());
            switch (entryType) {
                case DW_RLE_end_of_list:
                    done = true;
                    break;

                case DW_RLE_base_addressx: {
                    auto baseidx = r.getuleb128();
                    base = unit.addrx(baseidx);
                    break;
                }

                case DW_RLE_startx_endx: {
                    /* auto startx = */ r.getuleb128();
                    /* auto endx = */ r.getuleb128();
                    throw (Exception() << "DW_RLE_startx_endx is not handled");
                }

                case DW_RLE_startx_length: {
                    auto start = unit.addrx(r.getuleb128());
                    auto len = r.getuleb128();
                    emplace_back(start, start + len);
                    break;
                }

                case DW_RLE_offset_pair: {
                    auto offstart = r.getuleb128();
                    auto offend = r.getuleb128();
                    emplace_back(offstart + base, offend + base);
                    break;
                }

                case DW_RLE_base_address:
                    base = r.getuint(addrlen);
                    break;

                case DW_RLE_start_end: {
                    auto start = r.getuint(addrlen);
                    auto end = r.getuint(addrlen);
                    emplace_back(start, end);
                    break;
                }
                case DW_RLE_start_length: {
                    auto start = r.getuint(addrlen);
                    auto len = r.getuleb128();
                    emplace_back(start, start + len);
                    break;
                }
                default:
                    throw (Exception() << "unhandled DW_RLE_ entry " << entryType);
            }
        }
    }
}